

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O2

void __thiscall miniminer_tests::miniminer_1p1c::test_method(miniminer_1p1c *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  CTxMemPool *this_00;
  element_type *peVar3;
  CTxMemPoolEntry *this_01;
  uchar *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  uint256 *puVar11;
  base_blob<256U> *pbVar12;
  pointer pCVar13;
  pointer pCVar14;
  bool bVar15;
  int32_t iVar16;
  uint32_t num_bytes;
  uint uVar17;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar18;
  CTransaction *pCVar19;
  CTxMemPoolEntry **ppCVar20;
  _Rb_tree_node_base *p_Var21;
  _Base_ptr p_Var22;
  pointer target_feerate;
  iterator iVar23;
  iterator iVar24;
  CAmount CVar25;
  iterator iVar26;
  mapped_type *pmVar27;
  _Base_ptr *pp_Var28;
  long lVar29;
  _Base_ptr p_Var30;
  pointer pCVar31;
  map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
  *map;
  char *pcVar32;
  iterator pvVar33;
  allocator_type *__a;
  _Base_ptr p_Var34;
  iterator pvVar35;
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  *pmVar36;
  vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *pvVar37;
  int32_t *piVar38;
  CFeeRate *pCVar39;
  CAmount *pCVar40;
  MiniMiner *__args_4;
  CFeeRate *pCVar41;
  pointer pCVar42;
  _Rb_tree_node_base *b;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  *bumpfees;
  shared_ptr<const_CTransaction> *tx;
  pointer psVar43;
  COutPoint *outpoint;
  long in_FS_OFFSET;
  initializer_list<COutPoint> __l;
  initializer_list<COutPoint> __l_00;
  initializer_list<COutPoint> __l_01;
  initializer_list<COutPoint> __l_02;
  initializer_list<COutPoint> __l_03;
  initializer_list<COutPoint> __l_04;
  initializer_list<COutPoint> __l_05;
  initializer_list<COutPoint> __l_06;
  initializer_list<COutPoint> __l_07;
  const_string file;
  initializer_list<COutPoint> __l_08;
  const_string file_00;
  initializer_list<COutPoint> __l_09;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_10;
  initializer_list<CFeeRate> __l_11;
  initializer_list<COutPoint> __l_12;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  initializer_list<transaction_identifier<false>_> __l_13;
  initializer_list<transaction_identifier<false>_> __l_14;
  initializer_list<transaction_identifier<false>_> __l_15;
  initializer_list<transaction_identifier<false>_> __l_16;
  initializer_list<transaction_identifier<false>_> __l_17;
  initializer_list<transaction_identifier<false>_> __l_18;
  initializer_list<transaction_identifier<false>_> __l_19;
  initializer_list<transaction_identifier<false>_> __l_20;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  check_type cVar44;
  char *local_df8;
  char *local_df0;
  undefined1 *local_de8;
  undefined1 *local_de0;
  char *local_dd8;
  char *local_dd0;
  char *local_dc8;
  char *local_dc0;
  undefined1 *local_db8;
  undefined1 *local_db0;
  char *local_da8;
  char *local_da0;
  char *local_d98;
  char *local_d90;
  undefined1 *local_d88;
  undefined1 *local_d80;
  char *local_d78;
  char *local_d70;
  char *local_d68;
  char *local_d60;
  undefined1 *local_d58;
  undefined1 *local_d50;
  char *local_d48;
  char *local_d40;
  char *local_d38;
  char *local_d30;
  undefined1 *local_d28;
  undefined1 *local_d20;
  char *local_d18;
  char *local_d10;
  char *local_d08;
  char *local_d00;
  undefined1 *local_cf8;
  undefined1 *local_cf0;
  char *local_ce8;
  char *local_ce0;
  char *local_cd8;
  char *local_cd0;
  undefined1 *local_cc8;
  undefined1 *local_cc0;
  char *local_cb8;
  char *local_cb0;
  char *local_ca8;
  char *local_ca0;
  undefined1 *local_c98;
  undefined1 *local_c90;
  char *local_c88;
  char *local_c80;
  char *local_c78;
  char *local_c70;
  undefined1 *local_c68;
  undefined1 *local_c60;
  char *local_c58;
  char *local_c50;
  char *local_c48;
  char *local_c40;
  undefined1 *local_c38;
  undefined1 *local_c30;
  char *local_c28;
  char *local_c20;
  int local_c14;
  int32_t tx7_vsize;
  undefined4 uStack_c0c;
  char *local_c08;
  char *local_c00;
  undefined1 *local_bf8;
  undefined1 *local_bf0;
  char *local_be8;
  char *local_be0;
  char *local_bd8;
  char *local_bd0;
  undefined1 *local_bc8;
  undefined1 *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  undefined1 *local_b98;
  undefined1 *local_b90;
  char *local_b88;
  char *local_b80;
  char *local_b78;
  char *local_b70;
  undefined1 *local_b68;
  undefined1 *local_b60;
  char *local_b58;
  char *local_b50;
  char *local_b48;
  char *local_b40;
  undefined1 *local_b38;
  undefined1 *local_b30;
  char *local_b28;
  char *local_b20;
  char *local_b18;
  char *local_b10;
  undefined1 *local_b08;
  undefined1 *local_b00;
  char *local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  CAmount bumpfee4;
  _Base_ptr local_ad0;
  CFeeRate tx4_feerate;
  shared_count sStack_ab8;
  _Base_ptr local_ab0;
  undefined1 *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  undefined1 *local_a80;
  undefined1 *local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  undefined1 *local_a50;
  undefined1 *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  undefined1 *local_a20;
  undefined1 *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  char *local_9f8;
  undefined1 *local_9f0;
  undefined1 *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  char *local_9c8;
  undefined1 *local_9c0;
  undefined1 *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  undefined1 *local_990;
  undefined1 *local_988;
  char *local_980;
  char *local_978;
  long it4_spent;
  char *local_968;
  _Base_ptr local_960;
  _Base_ptr local_958;
  undefined1 *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  undefined1 *local_898;
  undefined1 *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  undefined1 *local_868;
  undefined1 *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  undefined1 *local_808;
  undefined1 *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  vector<COutPoint,_std::allocator<COutPoint>_> nonexistent_outpoints;
  vector<CFeeRate,_std::allocator<CFeeRate>_> various_normal_feerates;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  all_transactions;
  vector<COutPoint,_std::allocator<COutPoint>_> all_parent_outputs;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  vector<COutPoint,_std::allocator<COutPoint>_> all_spent_outpoints;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  vector<COutPoint,_std::allocator<COutPoint>_> all_unspent_outpoints;
  CTransactionRef tx7;
  CTransactionRef tx6;
  CAmount tx5_mod_fee;
  CAmount tx5_delta;
  CTransactionRef tx5;
  CTransactionRef tx4;
  CTransactionRef tx3;
  CTransactionRef tx2;
  CTransactionRef tx1;
  CTransactionRef tx0;
  TestMemPoolEntryHelper entry;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> miniminer_info;
  int32_t tx1_vsize;
  undefined4 uStack_424;
  element_type *peStack_420;
  shared_count local_418;
  _Base_ptr p_Stack_410;
  uint32_t local_408;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  local_3f8;
  CFeeRate tx2_feerate;
  shared_count sStack_3b8;
  _Base_ptr local_3b0;
  pointer local_3a0;
  MiniMiner miniminer_pool;
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  descendant_caches;
  MiniMiner miniminer_manual;
  map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
  tx_dims;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  puVar18 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                      (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.mempool,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                       ,0x6f,"test_method","m_node.mempool");
  this_00 = (puVar18->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t
            .super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
             ,0x70,false);
  pcVar32 = (char *)0x70;
  p_Var34 = (_Base_ptr)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,&this_00->cs,"pool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
             ,0x70,false);
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  peVar3 = (((this->super_TestChain100Setup).m_coinbase_txns.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar3->hash).m_wrapped;
  puVar4 = (uchar *)((long)&peVar3->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar4[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar4[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar4[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar4[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar4[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar4[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar4[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar4[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar3->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l,
             (allocator_type *)&tx1_vsize);
  make_tx((miniminer_tests *)&tx0,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 5000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx0);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  puVar11 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar11->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[7];
  pbVar12 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_00,
             (allocator_type *)&tx1_vsize);
  make_tx((miniminer_tests *)&tx1,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,1
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 5000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx1);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  peVar3 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar3->hash).m_wrapped;
  puVar4 = (uchar *)((long)&peVar3->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar4[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar4[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar4[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar4[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar4[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar4[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar4[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar4[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar3->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_01,
             (allocator_type *)&tx1_vsize);
  make_tx((miniminer_tests *)&tx2,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 500;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx2);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  puVar11 = &((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar11->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[7];
  pbVar12 = &((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_02,
             (allocator_type *)&tx1_vsize);
  make_tx((miniminer_tests *)&tx3,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,1
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx3);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  peVar3 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar3->hash).m_wrapped;
  puVar4 = (uchar *)((long)&peVar3->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar4[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar4[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar4[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar4[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar4[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar4[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar4[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar4[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar3->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_03,
             (allocator_type *)&tx1_vsize);
  make_tx((miniminer_tests *)&tx4,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 500;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx4);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  puVar11 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar11->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[7];
  pbVar12 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_04,
             (allocator_type *)&tx1_vsize);
  make_tx((miniminer_tests *)&tx5,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,1
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 500;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx5);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  tx5_delta = 10000;
  CTxMemPool::PrioritiseTransaction
            (this_00,&((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->hash).m_wrapped,&tx5_delta);
  tx5_mod_fee = 0x2904;
  peVar3 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar3->hash).m_wrapped;
  puVar4 = (uchar *)((long)&peVar3->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar4[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar4[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar4[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar4[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar4[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar4[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar4[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar4[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar3->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_05,
             (allocator_type *)&tx1_vsize);
  make_tx((miniminer_tests *)&tx6,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx6);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  puVar11 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar11->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[7];
  pbVar12 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_06,
             (allocator_type *)&tx1_vsize);
  make_tx((miniminer_tests *)&tx7,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,1
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 500;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx7);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  puVar11 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar11->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[7];
  pbVar12 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 1;
  uVar5 = *(undefined8 *)
           ((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar6 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar7 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar8 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
       (undefined4)uVar5;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
       (undefined4)((ulong)uVar5 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
       (undefined4)uVar6;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       (undefined4)((ulong)uVar6 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (undefined4)uVar7;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84((ulong)uVar7 >> 0x20,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ = SUB84(uVar8,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = (_Rb_tree_color)((ulong)uVar8 >> 0x20);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
       = 0;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = *(_Base_ptr *)
               ((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = *(_Base_ptr *)
             (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
              ).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = *(_Base_ptr *)
              (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl._4_8_ =
       *(undefined8 *)
        ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._4_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._12_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = 0
  ;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        ((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  pbVar12 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_bump_fees._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
  miniminer_manual.m_bump_fees._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
  miniminer_manual.m_bump_fees._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
  miniminer_manual.m_bump_fees._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
  miniminer_manual.m_bump_fees._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
  miniminer_manual.m_bump_fees._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
  miniminer_manual.m_bump_fees._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
  miniminer_manual.m_bump_fees._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        ((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._28_8_ =
       *(undefined8 *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual._196_8_ =
       *(undefined8 *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_in_block._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        ((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       *(_Base_ptr *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual._252_8_ =
       *(undefined8 *)
        ((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  pbVar12 = &((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual._260_1_ = (pbVar12->m_data)._M_elems[8];
  miniminer_manual._261_1_ = (pbVar12->m_data)._M_elems[9];
  miniminer_manual._262_1_ = (pbVar12->m_data)._M_elems[10];
  miniminer_manual._263_1_ = (pbVar12->m_data)._M_elems[0xb];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[0xc];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[0xd];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[0xe];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xf];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_8_ =
       *(undefined8 *)
        (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
       0;
  __l_07._M_len = 8;
  __l_07._M_array = (iterator)&miniminer_manual;
  miniminer_manual.m_inclusion_order._M_t._M_impl._0_4_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_;
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_;
  miniminer_manual.m_total_fees._0_4_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            (&all_unspent_outpoints,__l_07,(allocator_type *)&miniminer_pool);
  pCVar13 = all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (pCVar42 = all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                 _M_impl.super__Vector_impl_data._M_start; pCVar42 != pCVar13; pCVar42 = pCVar42 + 1
      ) {
    local_570 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_568 = "";
    local_580 = &boost::unit_test::basic_cstring<char_const>::null;
    local_578 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x9a;
    file.m_begin = (iterator)&local_570;
    msg.m_end = (iterator)p_Var34;
    msg.m_begin = pcVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_580,msg);
    _cVar44 = 0x395af5;
    bVar15 = CTxMemPool::isSpent(this_00,pCVar42);
    miniminer_pool.m_ready_to_calculate = !bVar15;
    miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ = 0;
    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _tx1_vsize = (undefined **)0xbb5bd6;
    peStack_420 = (element_type *)0xbb5bed;
    miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
         miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
    miniminer_manual._0_8_ = &PTR__lazy_ostream_011481f0;
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         boost::unit_test::lazy_ostream::inst;
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&tx1_vsize;
    local_590 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_588 = "";
    pcVar32 = &DAT_00000001;
    p_Var34 = (_Base_ptr)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,
               _cVar44,(size_t)&local_590,0x9a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  }
  puVar11 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar11->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[7];
  pbVar12 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  uVar5 = *(undefined8 *)
           ((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar6 = *(undefined8 *)
           (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar7 = *(undefined8 *)
           (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar8 = *(undefined8 *)
           (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
       (undefined4)uVar5;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
       (undefined4)((ulong)uVar5 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
       (undefined4)uVar6;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       (undefined4)((ulong)uVar6 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (undefined4)uVar7;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84((ulong)uVar7 >> 0x20,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ = SUB84(uVar8,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = (_Rb_tree_color)((ulong)uVar8 >> 0x20);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
       = 0;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = *(_Base_ptr *)
               ((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = *(_Base_ptr *)
             (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
              ).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = *(_Base_ptr *)
              (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl._0_4_ = 0;
  miniminer_manual.m_inclusion_order._M_t._M_impl._4_8_ =
       *(undefined8 *)
        ((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._4_8_ =
       *(undefined8 *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._12_8_ =
       *(undefined8 *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = 0
  ;
  __l_08._M_len = 4;
  __l_08._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            (&all_spent_outpoints,__l_08,(allocator_type *)&miniminer_pool);
  pCVar13 = all_spent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (pCVar42 = all_spent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                 _M_impl.super__Vector_impl_data._M_start; pCVar42 != pCVar13; pCVar42 = pCVar42 + 1
      ) {
    local_5b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_5b0 = "";
    local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0xa2;
    file_00.m_begin = (iterator)&local_5b8;
    msg_00.m_end = (iterator)p_Var34;
    msg_00.m_begin = pcVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_5c8,
               msg_00);
    _cVar44 = 0x395ce4;
    pCVar19 = CTxMemPool::GetConflictTx(this_00,pCVar42);
    miniminer_pool.m_ready_to_calculate = pCVar19 != (CTransaction *)0x0;
    miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ = 0;
    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _tx1_vsize = (undefined **)0xbb5bee;
    peStack_420 = (element_type *)0xbb5c15;
    miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
         miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
    miniminer_manual._0_8_ = &PTR__lazy_ostream_011481f0;
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         boost::unit_test::lazy_ostream::inst;
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&tx1_vsize;
    local_5d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_5d0 = "";
    pcVar32 = &DAT_00000001;
    p_Var34 = (_Base_ptr)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,
               _cVar44,(size_t)&local_5d8,0xa2);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  }
  puVar11 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar11->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[7];
  pbVar12 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  uVar5 = *(undefined8 *)
           ((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar6 = *(undefined8 *)
           (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar7 = *(undefined8 *)
           (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar8 = *(undefined8 *)
           (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
       (undefined4)uVar5;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
       (undefined4)((ulong)uVar5 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
       (undefined4)uVar6;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       (undefined4)((ulong)uVar6 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (undefined4)uVar7;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84((ulong)uVar7 >> 0x20,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ = SUB84(uVar8,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = (_Rb_tree_color)((ulong)uVar8 >> 0x20);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
       = 1;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = *(_Base_ptr *)
               ((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = *(_Base_ptr *)
             (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
              ).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = *(_Base_ptr *)
              (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl._0_4_ = 0;
  miniminer_manual.m_inclusion_order._M_t._M_impl._4_8_ =
       *(undefined8 *)
        ((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._4_8_ =
       *(undefined8 *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._12_8_ =
       *(undefined8 *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        ((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  pbVar12 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_bump_fees._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
  miniminer_manual.m_bump_fees._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
  miniminer_manual.m_bump_fees._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
  miniminer_manual.m_bump_fees._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
  miniminer_manual.m_bump_fees._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
  miniminer_manual.m_bump_fees._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
  miniminer_manual.m_bump_fees._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
  miniminer_manual.m_bump_fees._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        ((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._28_8_ =
       *(undefined8 *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual._196_8_ =
       *(undefined8 *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_in_block._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        ((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       *(_Base_ptr *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_total_fees._0_4_ = 0;
  miniminer_manual._252_8_ =
       *(undefined8 *)
        ((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  pbVar12 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual._260_1_ = (pbVar12->m_data)._M_elems[8];
  miniminer_manual._261_1_ = (pbVar12->m_data)._M_elems[9];
  miniminer_manual._262_1_ = (pbVar12->m_data)._M_elems[10];
  miniminer_manual._263_1_ = (pbVar12->m_data)._M_elems[0xb];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[0xc];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[0xd];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[0xe];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xf];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_8_ =
       *(undefined8 *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  __l_09._M_len = 8;
  __l_09._M_array = (iterator)&miniminer_manual;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
       miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
       _4_4_;
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
       _4_4_;
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
       miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
       _4_4_;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            (&all_parent_outputs,__l_09,(allocator_type *)&miniminer_pool);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&miniminer_manual,
             &tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header,
             &tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left
             ,&tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header,
             &tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header.
              _M_header._M_left,
             &tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header.
              _M_node_count,&tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header,
             &tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_10._M_len = 8;
  __l_10._M_array = (iterator)&miniminer_manual;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&all_transactions,__l_10,(allocator_type *)&miniminer_pool);
  lVar29 = 0x78;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (&miniminer_manual.m_ready_to_calculate + lVar29));
    lVar29 = lVar29 + -0x10;
  } while (lVar29 != -8);
  p_Var1 = &tx_dims._M_t._M_impl.super__Rb_tree_header;
  tx_dims._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tx_dims._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tx_dims._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar43 = all_transactions.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  tx_dims._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  tx_dims._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  do {
    if (psVar43 ==
        all_transactions.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      miniminer_manual.m_ready_to_calculate = false;
      miniminer_manual._1_7_ = 0;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ = 500;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 999;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&DAT_000003e8;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           2000;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           0;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = 0x9c4;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = 0;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           0xd05;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = 0x1e78;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ = 0;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = 0x2bbf;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _4_4_ = 0;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x5b22;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)0xc350;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = (_Base_ptr)0x4c4b40;
      __l_11._M_len = 0xc;
      __l_11._M_array = (iterator)&miniminer_manual;
      std::vector<CFeeRate,_std::allocator<CFeeRate>_>::vector
                (&various_normal_feerates,__l_11,(allocator_type *)&miniminer_pool);
      GetRandHash();
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      miniminer_manual.m_ready_to_calculate = miniminer_pool.m_ready_to_calculate;
      miniminer_manual._1_7_ = miniminer_pool._1_7_;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           0;
      GetRandHash();
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           SUB84(local_418.pi_,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ =
           SUB84((ulong)local_418.pi_ >> 0x20,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ = SUB84(p_Stack_410,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = (_Rb_tree_color)((ulong)p_Stack_410 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           SUB84(_tx1_vsize,0);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)((ulong)_tx1_vsize >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = SUB84(peStack_420,0);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)((ulong)peStack_420 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _4_4_ = 3;
      __l_12._M_len = 2;
      __l_12._M_array = (iterator)&miniminer_manual;
      std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
                (&nonexistent_outpoints,__l_12,(allocator_type *)&descendant_caches);
      pCVar13 = nonexistent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (pCVar42 = nonexistent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pCVar31 = various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>.
                    _M_impl.super__Vector_impl_data._M_finish, pCVar42 != pCVar13;
          pCVar42 = pCVar42 + 1) {
        local_648 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_640 = "";
        local_658 = &boost::unit_test::basic_cstring<char_const>::null;
        local_650 = &boost::unit_test::basic_cstring<char_const>::null;
        file_01.m_end = (iterator)0xc2;
        file_01.m_begin = (iterator)&local_648;
        msg_01.m_end = (iterator)p_Var34;
        msg_01.m_begin = pcVar32;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_658
                   ,msg_01);
        _cVar44 = 0x3962c2;
        bVar15 = CTxMemPool::isSpent(this_00,pCVar42);
        miniminer_pool.m_ready_to_calculate = !bVar15;
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ = 0;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        _tx1_vsize = (undefined **)0xbb5bd6;
        peStack_420 = (element_type *)0xbb5bed;
        miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
             miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
        miniminer_manual._0_8_ = &PTR__lazy_ostream_011481f0;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&tx1_vsize;
        local_668 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_660 = "";
        pcVar32 = &DAT_00000001;
        p_Var34 = (_Base_ptr)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,
                   _cVar44,(size_t)&local_668,0xc2);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
      }
      for (target_feerate =
                various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>.
                _M_impl.super__Vector_impl_data._M_start;
          pCVar14 = various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>.
                    _M_impl.super__Vector_impl_data._M_finish, target_feerate != pCVar31;
          target_feerate = target_feerate + 1) {
        ::node::MiniMiner::MiniMiner(&miniminer_manual,this_00,&nonexistent_outpoints);
        local_678 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_670 = "";
        local_688 = &boost::unit_test::basic_cstring<char_const>::null;
        local_680 = &boost::unit_test::basic_cstring<char_const>::null;
        _cVar44 = 0x396421;
        file_02.m_end = (iterator)0xc5;
        file_02.m_begin = (iterator)&local_678;
        msg_02.m_end = (iterator)p_Var34;
        msg_02.m_begin = pcVar32;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_688
                   ,msg_02);
        _tx1_vsize = (undefined **)
                     CONCAT71(stack0xfffffffffffffbd9,miniminer_manual.m_ready_to_calculate);
        peStack_420 = (element_type *)0x0;
        local_418.pi_ = (sp_counted_base *)0x0;
        descendant_caches._M_t._M_impl._0_8_ = (long)"!mini_miner.IsReadyToCalculate()" + 1;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             (long)"!mini_miner.IsReadyToCalculate()" + 0x20;
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
             miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
        miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&descendant_caches;
        local_698 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_690 = "";
        pvVar33 = &DAT_00000001;
        pvVar35 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx1_vsize,(lazy_ostream *)&miniminer_pool,1,0,WARN,_cVar44,
                   (size_t)&local_698,0xc5);
        boost::detail::shared_count::~shared_count(&local_418);
        ::node::MiniMiner::CalculateBumpFees
                  ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    *)&miniminer_pool,&miniminer_manual,target_feerate);
        local_6a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_6a0 = "";
        local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
        _cVar44 = 0x396547;
        file_03.m_end = (iterator)0xc7;
        file_03.m_begin = (iterator)&local_6a8;
        msg_03.m_end = pvVar35;
        msg_03.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_6b8
                   ,msg_03);
        descendant_caches._M_t._M_impl._0_8_ =
             CONCAT71(descendant_caches._M_t._M_impl._1_7_,miniminer_manual.m_ready_to_calculate) ^
             1;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        tx2_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_90df22;
        peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
        _tx1_vsize = &PTR__lazy_ostream_011481f0;
        local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        p_Stack_410 = (_Base_ptr)&tx2_feerate;
        local_6c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_6c0 = "";
        pvVar33 = &DAT_00000001;
        pvVar35 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&descendant_caches,(lazy_ostream *)&tx1_vsize,1,0,WARN,
                   _cVar44,(size_t)&local_6c8,199);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        local_6d8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_6d0 = "";
        local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_04.m_end = (iterator)0xc8;
        file_04.m_begin = (iterator)&local_6d8;
        msg_04.m_end = pvVar35;
        msg_04.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_6e8
                   ,msg_04);
        _cVar44 = 0x396661;
        bVar15 = sanity_check(&all_transactions,
                              (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                               *)&miniminer_pool);
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        tx2_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_90df38;
        peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
        _tx1_vsize = &PTR__lazy_ostream_011481f0;
        local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        p_Stack_410 = (_Base_ptr)&tx2_feerate;
        local_6f8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_6f0 = "";
        pvVar33 = &DAT_00000001;
        pvVar35 = (iterator)0x0;
        descendant_caches._M_t._M_impl._0_1_ = bVar15;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&descendant_caches,(lazy_ostream *)&tx1_vsize,1,0,WARN,
                   _cVar44,(size_t)&local_6f8,200);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        local_708 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_700 = "";
        local_718 = &boost::unit_test::basic_cstring<char_const>::null;
        local_710 = &boost::unit_test::basic_cstring<char_const>::null;
        file_05.m_end = (iterator)0xc9;
        file_05.m_begin = (iterator)&local_708;
        msg_05.m_end = pvVar35;
        msg_05.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_718
                   ,msg_05);
        descendant_caches._M_t._M_impl._0_1_ =
             miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right
             == (_Base_ptr)
                (((long)nonexistent_outpoints.
                        super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)nonexistent_outpoints.
                       super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x24);
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        tx2_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_90df42;
        peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
        _tx1_vsize = &PTR__lazy_ostream_011481f0;
        local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        p_Stack_410 = (_Base_ptr)&tx2_feerate;
        local_728 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_720 = "";
        pcVar32 = &DAT_00000001;
        p_Var34 = (_Base_ptr)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&descendant_caches,(lazy_ostream *)&tx1_vsize,1,0,WARN,0x24,
                   (size_t)&local_728,0xc9);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        pCVar13 = nonexistent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (pCVar42 = nonexistent_outpoints.
                       super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                       super__Vector_impl_data._M_start; pCVar42 != pCVar13; pCVar42 = pCVar42 + 1)
        {
          iVar23 = std::
                   _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                   ::find((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                           *)&miniminer_pool,pCVar42);
          local_738 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_730 = "";
          local_748 = &boost::unit_test::basic_cstring<char_const>::null;
          local_740 = &boost::unit_test::basic_cstring<char_const>::null;
          _cVar44 = 0x3968cd;
          file_06.m_end = (iterator)0xcc;
          file_06.m_begin = (iterator)&local_738;
          msg_06.m_end = (iterator)p_Var34;
          msg_06.m_begin = pcVar32;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                     (size_t)&local_748,msg_06);
          descendant_caches._M_t._M_impl._0_1_ =
               iVar23._M_node != (_Base_ptr)&miniminer_pool.m_to_be_replaced;
          descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          tx2_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_90df58;
          peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
          _tx1_vsize = &PTR__lazy_ostream_011481f0;
          local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          p_Stack_410 = (_Base_ptr)&tx2_feerate;
          local_758 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_750 = "";
          pvVar33 = &DAT_00000001;
          pvVar35 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&descendant_caches,(lazy_ostream *)&tx1_vsize,1,0,WARN,
                     _cVar44,(size_t)&local_758,0xcc);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)
                     &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          local_768 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_760 = "";
          local_778 = &boost::unit_test::basic_cstring<char_const>::null;
          local_770 = &boost::unit_test::basic_cstring<char_const>::null;
          file_07.m_end = (iterator)0xcd;
          file_07.m_begin = (iterator)&local_768;
          msg_07.m_end = pvVar35;
          msg_07.m_begin = pvVar33;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                     (size_t)&local_778,msg_07);
          peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
          _tx1_vsize = &PTR__lazy_ostream_011480b0;
          local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          p_Stack_410 = (_Base_ptr)0xc7f1cc;
          local_788 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_780 = "";
          p_Var34 = (_Base_ptr)&iVar23._M_node[2]._M_parent;
          descendant_caches._M_t._M_impl._0_8_ =
               descendant_caches._M_t._M_impl._0_8_ & 0xffffffff00000000;
          pcVar32 = (char *)0x2;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                    (&tx1_vsize,&local_788,0xcd,1,2,p_Var34,"it->second",&descendant_caches,"0");
        }
        std::
        _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                     *)&miniminer_pool);
        ::node::MiniMiner::~MiniMiner(&miniminer_manual);
      }
      for (pCVar31 = various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pCVar41 = various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>.
                    _M_impl.super__Vector_impl_data._M_start, pCVar31 != pCVar14;
          pCVar31 = pCVar31 + 1) {
        ::node::MiniMiner::MiniMiner(&miniminer_manual,this_00,&all_unspent_outpoints);
        local_798 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_790 = "";
        local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
        _cVar44 = 0x396b3e;
        file_08.m_end = (iterator)0xd4;
        file_08.m_begin = (iterator)&local_798;
        msg_08.m_end = (iterator)p_Var34;
        msg_08.m_begin = pcVar32;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_7a8
                   ,msg_08);
        _tx1_vsize = (undefined **)
                     CONCAT71(stack0xfffffffffffffbd9,miniminer_manual.m_ready_to_calculate);
        peStack_420 = (element_type *)0x0;
        local_418.pi_ = (sp_counted_base *)0x0;
        descendant_caches._M_t._M_impl._0_8_ = (long)"!mini_miner.IsReadyToCalculate()" + 1;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             (long)"!mini_miner.IsReadyToCalculate()" + 0x20;
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
             miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
        miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&descendant_caches;
        local_7b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_7b0 = "";
        pvVar33 = &DAT_00000001;
        pvVar35 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx1_vsize,(lazy_ostream *)&miniminer_pool,1,0,WARN,_cVar44,
                   (size_t)&local_7b8,0xd4);
        boost::detail::shared_count::~shared_count(&local_418);
        ::node::MiniMiner::CalculateBumpFees
                  ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    *)&miniminer_pool,&miniminer_manual,pCVar31);
        local_7c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_7c0 = "";
        local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
        _cVar44 = 0x396c64;
        file_09.m_end = (iterator)0xd6;
        file_09.m_begin = (iterator)&local_7c8;
        msg_09.m_end = pvVar35;
        msg_09.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_7d8
                   ,msg_09);
        descendant_caches._M_t._M_impl._0_8_ =
             CONCAT71(descendant_caches._M_t._M_impl._1_7_,miniminer_manual.m_ready_to_calculate) ^
             1;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        tx2_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_90df22;
        peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
        _tx1_vsize = &PTR__lazy_ostream_011481f0;
        local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        p_Stack_410 = (_Base_ptr)&tx2_feerate;
        local_7e8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_7e0 = "";
        pvVar33 = &DAT_00000001;
        pvVar35 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&descendant_caches,(lazy_ostream *)&tx1_vsize,1,0,WARN,
                   _cVar44,(size_t)&local_7e8,0xd6);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        local_7f8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_7f0 = "";
        local_808 = &boost::unit_test::basic_cstring<char_const>::null;
        local_800 = &boost::unit_test::basic_cstring<char_const>::null;
        file_10.m_end = (iterator)0xd7;
        file_10.m_begin = (iterator)&local_7f8;
        msg_10.m_end = pvVar35;
        msg_10.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_808
                   ,msg_10);
        _cVar44 = 0x396d78;
        bVar15 = sanity_check(&all_transactions,
                              (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                               *)&miniminer_pool);
        descendant_caches._M_t._M_impl._0_1_ = bVar15;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        tx2_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_90df38;
        peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
        _tx1_vsize = &PTR__lazy_ostream_011481f0;
        local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        p_Stack_410 = (_Base_ptr)&tx2_feerate;
        local_818 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_810 = "";
        pvVar33 = &DAT_00000001;
        pvVar35 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&descendant_caches,(lazy_ostream *)&tx1_vsize,1,0,WARN,
                   _cVar44,(size_t)&local_818,0xd7);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        local_828 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_820 = "";
        local_838 = &boost::unit_test::basic_cstring<char_const>::null;
        local_830 = &boost::unit_test::basic_cstring<char_const>::null;
        file_11.m_end = (iterator)0xd8;
        file_11.m_begin = (iterator)&local_828;
        msg_11.m_end = pvVar35;
        msg_11.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_838
                   ,msg_11);
        peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
        _tx1_vsize = &PTR__lazy_ostream_011480b0;
        local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        p_Stack_410 = (_Base_ptr)0xc7f1cc;
        local_848 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_840 = "";
        descendant_caches._M_t._M_impl._0_8_ =
             miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        tx2_feerate.nSatoshisPerK =
             ((long)all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x24;
        pvVar33 = (iterator)0x2;
        pmVar36 = &descendant_caches;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                  ((COutPoint *)&tx1_vsize,&local_848,0xd8,1,2,pmVar36,"bump_fees.size()",
                   &tx2_feerate,"all_unspent_outpoints.size()",0x24);
        iVar24 = std::
                 map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                 ::find(&tx_dims,&((tx0.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->hash).m_wrapped);
        _tx1_vsize = *(undefined ***)
                      ((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        peStack_420 = *(element_type **)
                       (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        local_418.pi_ =
             *(sp_counted_base **)
              (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        p_Stack_410 = *(_Base_ptr *)
                       (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        local_408 = 1;
        descendant_caches._M_t._M_impl._0_8_ =
             Find<COutPoint,long>
                       ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                         *)&miniminer_pool,(COutPoint *)&tx1_vsize);
        if ((long)iVar24._M_node[2]._M_left < pCVar31->nSatoshisPerK) {
          local_888 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_880 = "";
          local_898 = &boost::unit_test::basic_cstring<char_const>::null;
          local_890 = &boost::unit_test::basic_cstring<char_const>::null;
          file_12.m_end = (iterator)0xe1;
          file_12.m_begin = (iterator)&local_888;
          msg_12.m_end = (iterator)pmVar36;
          msg_12.m_begin = pvVar33;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,
                     (size_t)&local_898,msg_12);
          peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
          _tx1_vsize = &PTR__lazy_ostream_011480b0;
          local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          p_Stack_410 = (_Base_ptr)0xc7f1cc;
          local_8a8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_8a0 = "";
          CVar25 = CFeeRate::GetFee(pCVar31,iVar24._M_node[2]._M_color);
          tx2_feerate.nSatoshisPerK = CVar25 - (long)iVar24._M_node[2]._M_parent;
          pvVar33 = (iterator)0x2;
          pmVar36 = &descendant_caches;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                    ((COutPoint *)&tx1_vsize,&local_8a8,0xe1,1,2,pmVar36,"bumpfee0",&tx2_feerate,
                     "target_feerate.GetFee(tx0_dimensions.vsize) - tx0_dimensions.mod_fee");
        }
        else {
          local_858 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_850 = "";
          local_868 = &boost::unit_test::basic_cstring<char_const>::null;
          local_860 = &boost::unit_test::basic_cstring<char_const>::null;
          file_13.m_end = (iterator)0xde;
          file_13.m_begin = (iterator)&local_858;
          msg_13.m_end = (iterator)pmVar36;
          msg_13.m_begin = pvVar33;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,
                     (size_t)&local_868,msg_13);
          peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
          _tx1_vsize = &PTR__lazy_ostream_011480b0;
          local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          p_Stack_410 = (_Base_ptr)0xc7f1cc;
          local_878 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_870 = "";
          tx2_feerate.nSatoshisPerK = tx2_feerate.nSatoshisPerK & 0xffffffff00000000;
          pvVar33 = (iterator)0x2;
          pmVar36 = &descendant_caches;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                    ((COutPoint *)&tx1_vsize,&local_878,0xde,1,2,pmVar36,"bumpfee0",&tx2_feerate,"0"
                    );
        }
        iVar24 = std::
                 map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                 ::find(&tx_dims,&((tx2.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->hash).m_wrapped);
        iVar26 = std::
                 map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                 ::find(&tx_dims,&((tx3.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->hash).m_wrapped);
        _tx1_vsize = (undefined **)
                     ((long)&(iVar24._M_node[2]._M_parent)->_M_color +
                     (long)&(iVar26._M_node[2]._M_parent)->_M_color);
        CFeeRate::CFeeRate(&tx2_feerate,(CAmount *)&tx1_vsize,
                           iVar26._M_node[2]._M_color + iVar24._M_node[2]._M_color);
        _tx1_vsize = *(undefined ***)
                      ((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        peStack_420 = *(element_type **)
                       (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        local_418.pi_ =
             *(sp_counted_base **)
              (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        p_Stack_410 = *(_Base_ptr *)
                       (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        local_408 = 1;
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)Find<COutPoint,long>
                                ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                  *)&miniminer_pool,(COutPoint *)&tx1_vsize);
        if (tx2_feerate.nSatoshisPerK < pCVar31->nSatoshisPerK) {
          local_8e8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_8e0 = "";
          local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_14.m_end = (iterator)0xee;
          file_14.m_begin = (iterator)&local_8e8;
          msg_14.m_end = (iterator)pmVar36;
          msg_14.m_begin = pvVar33;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                     (size_t)&local_8f8,msg_14);
          peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
          _tx1_vsize = &PTR__lazy_ostream_011480b0;
          local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          p_Stack_410 = (_Base_ptr)0xc7f1cc;
          local_908 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_900 = "";
          CVar25 = CFeeRate::GetFee(pCVar31,iVar24._M_node[2]._M_color);
          pvVar37 = &miniminer_info;
          tx4_feerate.nSatoshisPerK = CVar25 - (long)iVar24._M_node[2]._M_parent;
          pvVar33 = (iterator)0x2;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                    ((COutPoint *)&tx1_vsize,&local_908,0xee,1,2,pvVar37,"bumpfee2",&tx4_feerate,
                     "target_feerate.GetFee(tx2_dimensions.vsize) - tx2_dimensions.mod_fee");
        }
        else {
          local_8b8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_8b0 = "";
          local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_15.m_end = (iterator)0xeb;
          file_15.m_begin = (iterator)&local_8b8;
          msg_15.m_end = (iterator)pmVar36;
          msg_15.m_begin = pvVar33;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                     (size_t)&local_8c8,msg_15);
          peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
          _tx1_vsize = &PTR__lazy_ostream_011480b0;
          local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          p_Stack_410 = (_Base_ptr)0xc7f1cc;
          local_8d8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_8d0 = "";
          tx4_feerate.nSatoshisPerK = tx4_feerate.nSatoshisPerK & 0xffffffff00000000;
          pvVar33 = (iterator)0x2;
          pvVar37 = &miniminer_info;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                    ((COutPoint *)&tx1_vsize,&local_8d8,0xeb,1,2,pvVar37,"bumpfee2",&tx4_feerate,"0"
                    );
        }
        iVar24 = std::
                 map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                 ::find(&tx_dims,&((tx4.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->hash).m_wrapped);
        iVar26 = std::
                 map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                 ::find(&tx_dims,&((tx5.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->hash).m_wrapped);
        _tx1_vsize = (undefined **)
                     ((long)&(iVar24._M_node[2]._M_parent)->_M_color +
                     (long)&(iVar26._M_node[2]._M_parent)->_M_color);
        CFeeRate::CFeeRate(&tx4_feerate,(CAmount *)&tx1_vsize,
                           iVar26._M_node[2]._M_color + iVar24._M_node[2]._M_color);
        _tx1_vsize = *(undefined ***)
                      ((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        peStack_420 = *(element_type **)
                       (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        local_418.pi_ =
             *(sp_counted_base **)
              (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        p_Stack_410 = *(_Base_ptr *)
                       (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        local_408 = 1;
        bumpfee4 = Find<COutPoint,long>
                             ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                               *)&miniminer_pool,(COutPoint *)&tx1_vsize);
        if (tx4_feerate.nSatoshisPerK < pCVar31->nSatoshisPerK) {
          local_948 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_940 = "";
          local_958 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
          local_950 = &boost::unit_test::basic_cstring<char_const>::null;
          file_16.m_end = (iterator)0x102;
          file_16.m_begin = (iterator)&local_948;
          msg_16.m_end = (iterator)pvVar37;
          msg_16.m_begin = pvVar33;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                     (size_t)&local_958,msg_16);
          peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
          _tx1_vsize = &PTR__lazy_ostream_011480b0;
          local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          p_Stack_410 = (_Base_ptr)0xc7f1cc;
          local_968 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_960 = (_Base_ptr)0xbb5970;
          CVar25 = CFeeRate::GetFee(pCVar31,iVar24._M_node[2]._M_color);
          it4_spent = CVar25 - (long)iVar24._M_node[2]._M_parent;
          pcVar32 = (char *)0x2;
          p_Var34 = (_Base_ptr)&bumpfee4;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                    ((COutPoint *)&tx1_vsize,&local_968,0x102,1,2,p_Var34,"bumpfee4",&it4_spent,
                     "target_feerate.GetFee(tx4_dimensions.vsize) - tx4_dimensions.mod_fee");
        }
        else {
          local_918 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_910 = "";
          local_928 = &boost::unit_test::basic_cstring<char_const>::null;
          local_920 = &boost::unit_test::basic_cstring<char_const>::null;
          file_17.m_end = (iterator)0xff;
          file_17.m_begin = (iterator)&local_918;
          msg_17.m_end = (iterator)pvVar37;
          msg_17.m_begin = pvVar33;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                     (size_t)&local_928,msg_17);
          peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
          _tx1_vsize = &PTR__lazy_ostream_011480b0;
          local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          p_Stack_410 = (_Base_ptr)0xc7f1cc;
          local_938 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_930 = "";
          it4_spent = it4_spent & 0xffffffff00000000;
          pcVar32 = (char *)0x2;
          p_Var34 = (_Base_ptr)&bumpfee4;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                    ((COutPoint *)&tx1_vsize,&local_938,0xff,1,2,p_Var34,"bumpfee4",&it4_spent,"0");
        }
        std::
        _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                     *)&miniminer_pool);
        ::node::MiniMiner::~MiniMiner(&miniminer_manual);
      }
      for (; p_Var30 = (_Base_ptr)&miniminer_info,
          pCVar41 !=
          various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>._M_impl.
          super__Vector_impl_data._M_finish; pCVar41 = pCVar41 + 1) {
        ::node::MiniMiner::MiniMiner(&miniminer_manual,this_00,&all_spent_outpoints);
        local_980 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_978 = "";
        local_990 = &boost::unit_test::basic_cstring<char_const>::null;
        local_988 = &boost::unit_test::basic_cstring<char_const>::null;
        _cVar44 = 0x39776c;
        file_18.m_end = (iterator)0x10a;
        file_18.m_begin = (iterator)&local_980;
        msg_18.m_end = (iterator)p_Var34;
        msg_18.m_begin = pcVar32;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_990
                   ,msg_18);
        tx1_vsize._0_1_ = miniminer_manual.m_ready_to_calculate;
        peStack_420 = (element_type *)0x0;
        local_418.pi_ = (sp_counted_base *)0x0;
        descendant_caches._M_t._M_impl._0_8_ =
             (long)"!mini_miner_all_spent.IsReadyToCalculate()" + 1;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             (long)"!mini_miner_all_spent.IsReadyToCalculate()" + 0x2a;
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
             miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
        miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_9a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_998 = "";
        pvVar33 = &DAT_00000001;
        pvVar35 = (iterator)0x0;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&descendant_caches;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx1_vsize,(lazy_ostream *)&miniminer_pool,1,0,WARN,_cVar44,
                   (size_t)&local_9a0,0x10a);
        boost::detail::shared_count::~shared_count(&local_418);
        ::node::MiniMiner::CalculateBumpFees
                  ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    *)&descendant_caches,&miniminer_manual,pCVar41);
        local_9b0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_9a8 = "";
        local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
        _cVar44 = 0x397895;
        file_19.m_end = (iterator)0x10c;
        file_19.m_begin = (iterator)&local_9b0;
        msg_19.m_end = pvVar35;
        msg_19.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_9c0
                   ,msg_19);
        _tx1_vsize = (undefined **)
                     (CONCAT71(stack0xfffffffffffffbd9,miniminer_manual.m_ready_to_calculate) ^ 1);
        peStack_420 = (element_type *)0x0;
        local_418.pi_ = (sp_counted_base *)0x0;
        tx2_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_90e004;
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
             miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
        miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&tx2_feerate;
        local_9d0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_9c8 = "";
        pvVar33 = &DAT_00000001;
        pvVar35 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx1_vsize,(lazy_ostream *)&miniminer_pool,1,0,WARN,_cVar44,
                   (size_t)&local_9d0,0x10c);
        boost::detail::shared_count::~shared_count(&local_418);
        local_9e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_9d8 = "";
        local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_9e8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_20.m_end = (iterator)0x10d;
        file_20.m_begin = (iterator)&local_9e0;
        msg_20.m_end = pvVar35;
        msg_20.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_9f0
                   ,msg_20);
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
             miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
        miniminer_pool._0_8_ = &PTR__lazy_ostream_011480b0;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0xc7f1cc;
        local_a00 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_9f8 = "";
        _tx1_vsize = (undefined **)
                     descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count;
        tx2_feerate.nSatoshisPerK =
             ((long)all_spent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)all_spent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x24;
        pvVar33 = (iterator)0x2;
        piVar38 = &tx1_vsize;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                  (&miniminer_pool,&local_a00,0x10d,1,2,piVar38,"bump_fees_all_spent.size()",
                   &tx2_feerate,"all_spent_outpoints.size()",0x24);
        ::node::MiniMiner::MiniMiner(&miniminer_pool,this_00,&all_parent_outputs);
        local_a10 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_a08 = "";
        local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
        local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
        _cVar44 = 0x397acc;
        file_21.m_end = (iterator)0x10f;
        file_21.m_begin = (iterator)&local_a10;
        msg_21.m_end = (iterator)piVar38;
        msg_21.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_a20
                   ,msg_21);
        tx2_feerate.nSatoshisPerK._0_1_ = miniminer_pool.m_ready_to_calculate;
        sStack_3b8.pi_ = (sp_counted_base *)0x0;
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbb5e3f;
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xbb5e6a;
        peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
        _tx1_vsize = &PTR__lazy_ostream_011481f0;
        local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_a30 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_a28 = "";
        pvVar33 = &DAT_00000001;
        pvVar35 = (iterator)0x0;
        p_Stack_410 = p_Var30;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx2_feerate,(lazy_ostream *)&tx1_vsize,1,0,WARN,_cVar44,
                   (size_t)&local_a30,0x10f);
        boost::detail::shared_count::~shared_count(&sStack_3b8);
        ::node::MiniMiner::CalculateBumpFees
                  ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    *)&tx2_feerate,&miniminer_pool,pCVar41);
        local_a40 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_a38 = "";
        local_a50 = &boost::unit_test::basic_cstring<char_const>::null;
        local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
        _cVar44 = 0x397bf0;
        file_22.m_end = (iterator)0x111;
        file_22.m_begin = (iterator)&local_a40;
        msg_22.m_end = pvVar35;
        msg_22.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_a50
                   ,msg_22);
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(CONCAT71(miniminer_info.
                                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                miniminer_pool.m_ready_to_calculate) ^ 1);
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tx4_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_90e04c;
        peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
        _tx1_vsize = &PTR__lazy_ostream_011481f0;
        local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        p_Stack_410 = (_Base_ptr)&tx4_feerate;
        local_a60 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_a58 = "";
        pvVar33 = &DAT_00000001;
        pvVar35 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)p_Var30,(lazy_ostream *)&tx1_vsize,1,0,WARN,_cVar44,
                   (size_t)&local_a60,0x111);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &miniminer_info.
                    super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_a70 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_a68 = "";
        local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
        local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
        file_23.m_end = (iterator)0x112;
        file_23.m_begin = (iterator)&local_a70;
        msg_23.m_end = pvVar35;
        msg_23.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_a80
                   ,msg_23);
        peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
        _tx1_vsize = &PTR__lazy_ostream_011480b0;
        local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        p_Stack_410 = (_Base_ptr)0xc7f1cc;
        local_a90 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_a88 = "";
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_start = local_3a0;
        tx4_feerate.nSatoshisPerK =
             ((long)all_parent_outputs.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)all_parent_outputs.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x24;
        pcVar32 = (char *)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                  ((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    *)&tx1_vsize,&local_a90,0x112,1,2,p_Var30,"bump_fees_all_parents.size()",
                   &tx4_feerate,"all_parent_outputs.size()",0x24);
        std::
        _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    *)&tx1_vsize,
                   (_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    *)&tx2_feerate);
        std::
        _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::_Rb_tree(&local_3f8,
                   (_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    *)&descendant_caches);
        for (lVar29 = 0; lVar29 != 0x60; lVar29 = lVar29 + 0x30) {
          local_aa0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_a98 = "";
          local_ab0 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
          local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_24.m_end = (iterator)0x116;
          file_24.m_begin = (iterator)&local_aa0;
          msg_24.m_end = (iterator)p_Var30;
          msg_24.m_begin = pcVar32;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,
                     (size_t)&local_ab0,msg_24);
          bumpfees = (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                      *)((long)&tx1_vsize + lVar29);
          _cVar44 = 0x397e55;
          bVar15 = sanity_check(&all_transactions,bumpfees);
          tx4_feerate.nSatoshisPerK._0_1_ = bVar15;
          sStack_ab8.pi_ = (sp_counted_base *)0x0;
          bumpfee4 = (CAmount)anon_var_dwarf_90df38;
          local_ad0 = (_Base_ptr)0xbb5c7d;
          miniminer_info.
          super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((ulong)miniminer_info.
                                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
          miniminer_info.
          super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011481f0;
          miniminer_info.
          super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)boost::unit_test::lazy_ostream::inst;
          local_ae8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_ae0 = "";
          pvVar33 = &DAT_00000001;
          pvVar35 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&tx4_feerate,(lazy_ostream *)&miniminer_info,1,0,WARN,
                     _cVar44,(size_t)&local_ae8,0x116);
          boost::detail::shared_count::~shared_count(&sStack_ab8);
          iVar24 = std::
                   map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                   ::find(&tx_dims,&((tx0.
                                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->hash).m_wrapped);
          miniminer_info.
          super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
          ._M_impl.super__Vector_impl_data._M_start =
               *(pointer *)
                ((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          miniminer_info.
          super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               *(pointer *)
                (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          miniminer_info.
          super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               *(pointer *)
                (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          tx4_feerate.nSatoshisPerK = Find<COutPoint,long>(bumpfees,(COutPoint *)&miniminer_info);
          if ((long)iVar24._M_node[2]._M_left < pCVar41->nSatoshisPerK) {
            local_b28 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_b20 = "";
            local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
            local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
            file_25.m_end = (iterator)0x11f;
            file_25.m_begin = (iterator)&local_b28;
            msg_25.m_end = pvVar35;
            msg_25.m_begin = pvVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,
                       (size_t)&local_b38,msg_25);
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((ulong)miniminer_info.
                                  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011480b0;
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)boost::unit_test::lazy_ostream::inst;
            local_b48 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_b40 = "";
            CVar25 = CFeeRate::GetFee(pCVar41,iVar24._M_node[2]._M_color);
            bumpfee4 = CVar25 - (long)iVar24._M_node[2]._M_parent;
            pvVar33 = (iterator)0x2;
            pCVar39 = &tx4_feerate;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                      (&miniminer_info,&local_b48,0x11f,1,2,pCVar39,"it0_spent",&bumpfee4,
                       "target_feerate.GetFee(tx0_dimensions.vsize) - tx0_dimensions.mod_fee");
          }
          else {
            local_af8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_af0 = "";
            local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
            local_b00 = &boost::unit_test::basic_cstring<char_const>::null;
            file_26.m_end = (iterator)0x11c;
            file_26.m_begin = (iterator)&local_af8;
            msg_26.m_end = pvVar35;
            msg_26.m_begin = pvVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,
                       (size_t)&local_b08,msg_26);
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((ulong)miniminer_info.
                                  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011480b0;
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)boost::unit_test::lazy_ostream::inst;
            local_b18 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_b10 = "";
            bumpfee4 = bumpfee4 & 0xffffffff00000000;
            pvVar33 = (iterator)0x2;
            pCVar39 = &tx4_feerate;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                      (&miniminer_info,&local_b18,0x11c,1,2,pCVar39,"it0_spent",&bumpfee4,"0");
          }
          iVar24 = std::
                   map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                   ::find(&tx_dims,&((tx2.
                                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->hash).m_wrapped);
          p_Var34 = iVar24._M_node[2]._M_left;
          miniminer_info.
          super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
          ._M_impl.super__Vector_impl_data._M_start =
               *(pointer *)
                ((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          miniminer_info.
          super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               *(pointer *)
                (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          miniminer_info.
          super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               *(pointer *)
                (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          bumpfee4 = Find<COutPoint,long>(bumpfees,(COutPoint *)&miniminer_info);
          if ((long)p_Var34 < pCVar41->nSatoshisPerK) {
            local_b88 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_b80 = "";
            local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
            local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
            file_27.m_end = (iterator)0x12a;
            file_27.m_begin = (iterator)&local_b88;
            msg_27.m_end = (iterator)pCVar39;
            msg_27.m_begin = pvVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,
                       (size_t)&local_b98,msg_27);
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((ulong)miniminer_info.
                                  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011480b0;
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)boost::unit_test::lazy_ostream::inst;
            local_ba8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_ba0 = "";
            CVar25 = CFeeRate::GetFee(pCVar41,iVar24._M_node[2]._M_color);
            it4_spent = CVar25 - (long)iVar24._M_node[2]._M_parent;
            pvVar33 = (iterator)0x2;
            pCVar40 = &bumpfee4;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                      (&miniminer_info,&local_ba8,0x12a,1,2,pCVar40,"it2_spent",&it4_spent,
                       "target_feerate.GetFee(tx2_dimensions.vsize) - tx2_dimensions.mod_fee");
          }
          else {
            local_b58 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_b50 = "";
            local_b68 = &boost::unit_test::basic_cstring<char_const>::null;
            local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
            file_28.m_end = (iterator)0x127;
            file_28.m_begin = (iterator)&local_b58;
            msg_28.m_end = (iterator)pCVar39;
            msg_28.m_begin = pvVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,
                       (size_t)&local_b68,msg_28);
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((ulong)miniminer_info.
                                  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011480b0;
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)boost::unit_test::lazy_ostream::inst;
            local_b78 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_b70 = "";
            it4_spent = it4_spent & 0xffffffff00000000;
            pvVar33 = (iterator)0x2;
            pCVar40 = &bumpfee4;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                      (&miniminer_info,&local_b78,0x127,1,2,pCVar40,"it2_spent",&it4_spent,"0");
          }
          iVar24 = std::
                   map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                   ::find(&tx_dims,&((tx4.
                                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->hash).m_wrapped);
          p_Var34 = iVar24._M_node[2]._M_left;
          miniminer_info.
          super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
          ._M_impl.super__Vector_impl_data._M_start =
               *(pointer *)
                ((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          miniminer_info.
          super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               *(pointer *)
                (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          miniminer_info.
          super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               *(pointer *)
                (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          it4_spent = Find<COutPoint,long>(bumpfees,(COutPoint *)&miniminer_info);
          if ((long)p_Var34 < pCVar41->nSatoshisPerK) {
            local_be8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_be0 = "";
            local_bf8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_29.m_end = (iterator)0x135;
            file_29.m_begin = (iterator)&local_be8;
            msg_29.m_end = (iterator)pCVar40;
            msg_29.m_begin = pvVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,
                       (size_t)&local_bf8,msg_29);
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((ulong)miniminer_info.
                                  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011480b0;
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)boost::unit_test::lazy_ostream::inst;
            local_c08 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_c00 = "";
            CVar25 = CFeeRate::GetFee(pCVar41,iVar24._M_node[2]._M_color);
            _tx7_vsize = CVar25 - (long)iVar24._M_node[2]._M_parent;
            pcVar32 = (char *)0x2;
            p_Var30 = (_Base_ptr)&it4_spent;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                      (&miniminer_info,&local_c08,0x135,1,2,p_Var30,"it4_spent",&tx7_vsize,
                       "target_feerate.GetFee(tx4_dimensions.vsize) - tx4_dimensions.mod_fee");
          }
          else {
            local_bb8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_bb0 = "";
            local_bc8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_30.m_end = (iterator)0x132;
            file_30.m_begin = (iterator)&local_bb8;
            msg_30.m_end = (iterator)pCVar40;
            msg_30.m_begin = pvVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,
                       (size_t)&local_bc8,msg_30);
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((ulong)miniminer_info.
                                  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011480b0;
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)boost::unit_test::lazy_ostream::inst;
            local_bd8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_bd0 = "";
            _tx7_vsize = _tx7_vsize & 0xffffffff00000000;
            pcVar32 = (char *)0x2;
            p_Var30 = (_Base_ptr)&it4_spent;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                      (&miniminer_info,&local_bd8,0x132,1,2,p_Var30,"it4_spent",&tx7_vsize,"0");
          }
        }
        lVar29 = 0x30;
        p_Var34 = p_Var30;
        do {
          std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
          ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                       *)((long)&tx1_vsize + lVar29));
          lVar29 = lVar29 + -0x30;
        } while (lVar29 != -0x30);
        std::
        _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                     *)&tx2_feerate);
        ::node::MiniMiner::~MiniMiner(&miniminer_pool);
        std::
        _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                     *)&descendant_caches);
        ::node::MiniMiner::~MiniMiner(&miniminer_manual);
      }
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pmVar27 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx0.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      miniminer_pool._0_4_ = pmVar27->vsize;
      pmVar27 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx1.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      _tx1_vsize = (undefined **)CONCAT44(uStack_424,pmVar27->vsize);
      pmVar27 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx2.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      descendant_caches._M_t._M_impl._0_4_ = pmVar27->vsize;
      pmVar27 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx3.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      tx2_feerate.nSatoshisPerK._0_4_ = pmVar27->vsize;
      pmVar27 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx4.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      tx4_feerate.nSatoshisPerK._0_4_ = pmVar27->vsize;
      pmVar27 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx5.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      bumpfee4 = CONCAT44(bumpfee4._4_4_,pmVar27->vsize);
      pmVar27 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx6.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      it4_spent = CONCAT44(it4_spent._4_4_,pmVar27->vsize);
      pmVar27 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx7.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      _tx7_vsize = CONCAT44(uStack_c0c,pmVar27->vsize);
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int_const&,long_const&,long_const&>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx0,(int *)&miniminer_pool,(int *)&miniminer_pool,&med_fee,
                 &med_fee);
      local_c14 = tx1_vsize + miniminer_pool._0_4_;
      miniminer_manual.m_ready_to_calculate = true;
      miniminer_manual._1_7_ = 0x27;
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int,long_const&,long>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx1,&tx1_vsize,&local_c14,&med_fee,(long *)&miniminer_manual);
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int_const&,long_const&,long_const&>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx2,(int *)&descendant_caches,(int *)&descendant_caches,&low_fee,
                 &low_fee);
      local_c14 = (int32_t)tx2_feerate.nSatoshisPerK + descendant_caches._M_t._M_impl._0_4_;
      miniminer_manual.m_ready_to_calculate = true;
      miniminer_manual._1_7_ = 0x188;
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int,long_const&,long>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx3,(int *)&tx2_feerate,&local_c14,&high_fee,
                 (long *)&miniminer_manual);
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int_const&,long_const&,long_const&>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx4,(int *)&tx4_feerate,(int *)&tx4_feerate,&low_fee,&low_fee);
      local_c14 = (int)bumpfee4 + (uint)tx4_feerate.nSatoshisPerK;
      miniminer_manual.m_ready_to_calculate = true;
      miniminer_manual._1_7_ = 0x2a;
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int,long_const&,long>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx5,(int *)&bumpfee4,&local_c14,&tx5_mod_fee,
                 (long *)&miniminer_manual);
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int_const&,long_const&,long_const&>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx6,(int *)&it4_spent,(int *)&it4_spent,&high_fee,&high_fee);
      local_c14 = tx7_vsize + (int)it4_spent;
      __args_4 = &miniminer_manual;
      miniminer_manual.m_ready_to_calculate = true;
      miniminer_manual._1_7_ = 0x188;
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int,long_const&,long>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx7,&tx7_vsize,&local_c14,&low_fee,(long *)__args_4);
      peVar3 = tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
      ;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      puVar11 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar11->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[7];
      pbVar12 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uVar5 = *(undefined8 *)
               ((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar6 = *(undefined8 *)
               (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar7 = *(undefined8 *)
               (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar8 = *(undefined8 *)
               (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           SUB84(uVar5,0);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           (undefined4)((ulong)uVar5 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)uVar6;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = (undefined4)((ulong)uVar6 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)uVar7;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (undefined4)((ulong)uVar7 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar8,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
           SUB84((ulong)uVar8 >> 0x20,0);
      __l_13._M_len = 2;
      __l_13._M_array = (iterator)&miniminer_manual;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_pool,__l_13,(less<transaction_identifier<false>_> *)&tx1_vsize,
            (allocator_type *)&tx2_feerate);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_pool);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_pool);
      peVar3 = tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar11 = &((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_pool.m_ready_to_calculate =
           (bool)(puVar11->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_pool._1_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_pool._2_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_pool._3_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_pool._4_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_pool._5_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_pool._6_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_pool._7_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[7];
      pbVar12 = &((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      __l_14._M_len = 1;
      __l_14._M_array = (iterator)&miniminer_pool;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_manual,__l_14,(less<transaction_identifier<false>_> *)&tx1_vsize,
            (allocator_type *)&tx2_feerate);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_manual);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_manual);
      peVar3 = tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar11 = &((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar11->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[7];
      pbVar12 = &((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uVar5 = *(undefined8 *)
               ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar6 = *(undefined8 *)
               (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar7 = *(undefined8 *)
               (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar8 = *(undefined8 *)
               (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           SUB84(uVar5,0);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           (undefined4)((ulong)uVar5 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)uVar6;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = (undefined4)((ulong)uVar6 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)uVar7;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (undefined4)((ulong)uVar7 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar8,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
           SUB84((ulong)uVar8 >> 0x20,0);
      __l_15._M_len = 2;
      __l_15._M_array = (iterator)&miniminer_manual;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_pool,__l_15,(less<transaction_identifier<false>_> *)&tx1_vsize,
            (allocator_type *)&tx2_feerate);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_pool);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_pool);
      peVar3 = tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar11 = &((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_pool.m_ready_to_calculate =
           (bool)(puVar11->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_pool._1_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_pool._2_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_pool._3_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_pool._4_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_pool._5_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_pool._6_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_pool._7_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[7];
      pbVar12 = &((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      __l_16._M_len = 1;
      __l_16._M_array = (iterator)&miniminer_pool;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_manual,__l_16,(less<transaction_identifier<false>_> *)&tx1_vsize,
            (allocator_type *)&tx2_feerate);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_manual);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_manual);
      peVar3 = tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar11 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar11->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[7];
      pbVar12 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uVar5 = *(undefined8 *)
               ((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar6 = *(undefined8 *)
               (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar7 = *(undefined8 *)
               (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar8 = *(undefined8 *)
               (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           SUB84(uVar5,0);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           (undefined4)((ulong)uVar5 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)uVar6;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = (undefined4)((ulong)uVar6 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)uVar7;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (undefined4)((ulong)uVar7 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar8,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
           SUB84((ulong)uVar8 >> 0x20,0);
      __l_17._M_len = 2;
      __l_17._M_array = (iterator)&miniminer_manual;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_pool,__l_17,(less<transaction_identifier<false>_> *)&tx1_vsize,
            (allocator_type *)&tx2_feerate);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_pool);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_pool);
      peVar3 = tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar11 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_pool.m_ready_to_calculate =
           (bool)(puVar11->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_pool._1_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_pool._2_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_pool._3_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_pool._4_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_pool._5_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_pool._6_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_pool._7_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[7];
      pbVar12 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      __l_18._M_len = 1;
      __l_18._M_array = (iterator)&miniminer_pool;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_manual,__l_18,(less<transaction_identifier<false>_> *)&tx1_vsize,
            (allocator_type *)&tx2_feerate);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_manual);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_manual);
      peVar3 = tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar11 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar11->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[7];
      pbVar12 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uVar5 = *(undefined8 *)
               ((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar6 = *(undefined8 *)
               (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar7 = *(undefined8 *)
               (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar8 = *(undefined8 *)
               (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           SUB84(uVar5,0);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           (undefined4)((ulong)uVar5 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)uVar6;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = (undefined4)((ulong)uVar6 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)uVar7;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (undefined4)((ulong)uVar7 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar8,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
           SUB84((ulong)uVar8 >> 0x20,0);
      __l_19._M_len = 2;
      __l_19._M_array = (iterator)&miniminer_manual;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_pool,__l_19,(less<transaction_identifier<false>_> *)&tx1_vsize,
            (allocator_type *)&tx2_feerate);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_pool);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_pool);
      peVar3 = tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar11 = &((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_pool.m_ready_to_calculate =
           (bool)(puVar11->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_pool._1_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_pool._2_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_pool._3_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_pool._4_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_pool._5_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_pool._6_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_pool._7_1_ = (puVar11->super_base_blob<256U>).m_data._M_elems[7];
      pbVar12 = &((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar12->m_data)._M_elems[8];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar12->m_data)._M_elems[9];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar12->m_data)._M_elems[10];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar12->m_data)._M_elems[0xb];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar12->m_data)._M_elems[0xc];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar12->m_data)._M_elems[0xd];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar12->m_data)._M_elems[0xe];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar12->m_data)._M_elems[0xf];
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      __a = (allocator_type *)&tx2_feerate;
      __l_20._M_len = 1;
      __l_20._M_array = (iterator)&miniminer_pool;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_manual,__l_20,(less<transaction_identifier<false>_> *)&tx1_vsize,__a);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_manual);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_manual);
      ::node::MiniMiner::MiniMiner(&miniminer_manual,&miniminer_info,&descendant_caches);
      ::node::MiniMiner::MiniMiner(&miniminer_pool,this_00,&all_unspent_outpoints);
      local_c28 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c20 = "";
      local_c38 = &boost::unit_test::basic_cstring<char_const>::null;
      local_c30 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar44 = 0x398ded;
      file_31.m_end = (iterator)0x15e;
      file_31.m_begin = (iterator)&local_c28;
      msg_31.m_end = &__args_4->m_ready_to_calculate;
      msg_31.m_begin = (iterator)__a;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_c38,
                 msg_31);
      tx2_feerate.nSatoshisPerK._0_1_ = miniminer_manual.m_ready_to_calculate;
      sStack_3b8.pi_ = (sp_counted_base *)0x0;
      tx4_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_90e0ac;
      peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
      _tx1_vsize = &PTR__lazy_ostream_011481f0;
      local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_c48 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c40 = "";
      pvVar33 = &DAT_00000001;
      pvVar35 = (iterator)0x0;
      p_Stack_410 = (_Base_ptr)&tx4_feerate;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&tx2_feerate,(lazy_ostream *)&tx1_vsize,1,0,WARN,_cVar44,
                 (size_t)&local_c48,0x15e);
      boost::detail::shared_count::~shared_count(&sStack_3b8);
      local_c58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c50 = "";
      local_c68 = &boost::unit_test::basic_cstring<char_const>::null;
      local_c60 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar44 = 0x398eb8;
      file_32.m_end = (iterator)0x15f;
      file_32.m_begin = (iterator)&local_c58;
      msg_32.m_end = pvVar35;
      msg_32.m_begin = pvVar33;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_c68,
                 msg_32);
      tx2_feerate.nSatoshisPerK._0_1_ = miniminer_pool.m_ready_to_calculate;
      sStack_3b8.pi_ = (sp_counted_base *)0x0;
      tx4_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_90e0c4;
      peStack_420 = (element_type *)((ulong)peStack_420 & 0xffffffffffffff00);
      _tx1_vsize = &PTR__lazy_ostream_011481f0;
      local_418.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_c78 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c70 = "";
      pvVar33 = &DAT_00000001;
      pCVar41 = (CFeeRate *)0x0;
      p_Stack_410 = (_Base_ptr)&tx4_feerate;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&tx2_feerate,(lazy_ostream *)&tx1_vsize,1,0,WARN,_cVar44,
                 (size_t)&local_c78,0x15f);
      boost::detail::shared_count::~shared_count(&sStack_3b8);
      ::node::MiniMiner::Linearize
                ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                  *)&tx1_vsize,&miniminer_manual);
      ::node::MiniMiner::Linearize
                ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                  *)&local_3f8,&miniminer_pool);
      for (lVar29 = 0; lVar29 != 0x60; lVar29 = lVar29 + 0x30) {
        local_c88 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_c80 = "";
        local_c98 = &boost::unit_test::basic_cstring<char_const>::null;
        local_c90 = &boost::unit_test::basic_cstring<char_const>::null;
        file_33.m_end = (iterator)0x162;
        file_33.m_begin = (iterator)&local_c88;
        msg_33.m_end = (iterator)pCVar41;
        msg_33.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_c98
                   ,msg_33);
        map = (map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
               *)((long)&tx1_vsize + lVar29);
        tx2_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_011480b0;
        sStack_3b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_3b0 = (_Base_ptr)0xc7f1cc;
        local_ca8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_ca0 = "";
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           (map,&(tx6.
                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = bumpfee4 & 0xffffffff00000000;
        pvVar33 = (iterator)0x2;
        pCVar41 = &tx4_feerate;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                  (&tx2_feerate,&local_ca8,0x162,1,2,&tx4_feerate,"Find(sequences, tx6->GetHash())",
                   &bumpfee4,"0");
        local_cb8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_cb0 = "";
        local_cc8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_cc0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_34.m_end = (iterator)0x165;
        file_34.m_begin = (iterator)&local_cb8;
        msg_34.m_end = (iterator)pCVar41;
        msg_34.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_cc8
                   ,msg_34);
        tx2_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_011480b0;
        sStack_3b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_3b0 = (_Base_ptr)0xc7f1cc;
        local_cd8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_cd0 = "";
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           (map,&(tx2.
                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = CONCAT44(bumpfee4._4_4_,1);
        pvVar33 = (iterator)0x2;
        pCVar41 = &tx4_feerate;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                  (&tx2_feerate,&local_cd8,0x165,1,2,&tx4_feerate,"Find(sequences, tx2->GetHash())",
                   &bumpfee4,"1");
        local_ce8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_ce0 = "";
        local_cf8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_cf0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_35.m_end = (iterator)0x166;
        file_35.m_begin = (iterator)&local_ce8;
        msg_35.m_end = (iterator)pCVar41;
        msg_35.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_cf8
                   ,msg_35);
        tx2_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_011480b0;
        sStack_3b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_3b0 = (_Base_ptr)0xc7f1cc;
        local_d08 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_d00 = "";
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           (map,&(tx3.
                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = CONCAT44(bumpfee4._4_4_,1);
        pvVar33 = (iterator)0x2;
        pCVar41 = &tx4_feerate;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                  (&tx2_feerate,&local_d08,0x166,1,2,&tx4_feerate,"Find(sequences, tx3->GetHash())",
                   &bumpfee4,"1");
        local_d18 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_d10 = "";
        local_d28 = &boost::unit_test::basic_cstring<char_const>::null;
        local_d20 = &boost::unit_test::basic_cstring<char_const>::null;
        file_36.m_end = (iterator)0x169;
        file_36.m_begin = (iterator)&local_d18;
        msg_36.m_end = (iterator)pCVar41;
        msg_36.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_d28
                   ,msg_36);
        tx2_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_011480b0;
        sStack_3b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_3b0 = (_Base_ptr)0xc7f1cc;
        local_d38 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_d30 = "";
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           (map,&(tx4.
                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = CONCAT44(bumpfee4._4_4_,2);
        pvVar33 = (iterator)0x2;
        pCVar41 = &tx4_feerate;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                  (&tx2_feerate,&local_d38,0x169,1,2,&tx4_feerate,"Find(sequences, tx4->GetHash())",
                   &bumpfee4,"2");
        local_d48 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_d40 = "";
        local_d58 = &boost::unit_test::basic_cstring<char_const>::null;
        local_d50 = &boost::unit_test::basic_cstring<char_const>::null;
        file_37.m_end = (iterator)0x16a;
        file_37.m_begin = (iterator)&local_d48;
        msg_37.m_end = (iterator)pCVar41;
        msg_37.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_d58
                   ,msg_37);
        tx2_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_011480b0;
        sStack_3b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_3b0 = (_Base_ptr)0xc7f1cc;
        local_d68 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_d60 = "";
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           (map,&(tx5.
                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = CONCAT44(bumpfee4._4_4_,2);
        pvVar33 = (iterator)0x2;
        pCVar41 = &tx4_feerate;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                  (&tx2_feerate,&local_d68,0x16a,1,2,&tx4_feerate,"Find(sequences, tx5->GetHash())",
                   &bumpfee4,"2");
        local_d78 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_d70 = "";
        local_d88 = &boost::unit_test::basic_cstring<char_const>::null;
        local_d80 = &boost::unit_test::basic_cstring<char_const>::null;
        file_38.m_end = (iterator)0x16c;
        file_38.m_begin = (iterator)&local_d78;
        msg_38.m_end = (iterator)pCVar41;
        msg_38.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_d88
                   ,msg_38);
        tx2_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_011480b0;
        sStack_3b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_3b0 = (_Base_ptr)0xc7f1cc;
        local_d98 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_d90 = "";
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           (map,&(tx0.
                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = CONCAT44(bumpfee4._4_4_,3);
        pvVar33 = (iterator)0x2;
        pCVar41 = &tx4_feerate;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                  (&tx2_feerate,&local_d98,0x16c,1,2,&tx4_feerate,"Find(sequences, tx0->GetHash())",
                   &bumpfee4,"3");
        local_da8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_da0 = "";
        local_db8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_db0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_39.m_end = (iterator)0x16d;
        file_39.m_begin = (iterator)&local_da8;
        msg_39.m_end = (iterator)pCVar41;
        msg_39.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_db8
                   ,msg_39);
        tx2_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_011480b0;
        sStack_3b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_3b0 = (_Base_ptr)0xc7f1cc;
        local_dc8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_dc0 = "";
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           (map,&(tx1.
                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = CONCAT44(bumpfee4._4_4_,3);
        pvVar33 = (iterator)0x2;
        pCVar41 = &tx4_feerate;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                  (&tx2_feerate,&local_dc8,0x16d,1,2,&tx4_feerate,"Find(sequences, tx1->GetHash())",
                   &bumpfee4,"3");
        local_dd8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_dd0 = "";
        local_de8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_de0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_40.m_end = (iterator)0x171;
        file_40.m_begin = (iterator)&local_dd8;
        msg_40.m_end = (iterator)pCVar41;
        msg_40.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_de8
                   ,msg_40);
        tx2_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_011480b0;
        sStack_3b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_3b0 = (_Base_ptr)0xc7f1cc;
        local_df8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_df0 = "";
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           (map,&(tx7.
                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = CONCAT44(bumpfee4._4_4_,4);
        pvVar33 = (iterator)0x2;
        pCVar41 = &tx4_feerate;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                  (&tx2_feerate,&local_df8,0x171,1,2,&tx4_feerate,"Find(sequences, tx7->GetHash())",
                   &bumpfee4,"4");
      }
      lVar29 = 0x30;
      do {
        std::
        _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                     *)((long)&tx1_vsize + lVar29));
        lVar29 = lVar29 + -0x30;
      } while (lVar29 != -0x30);
      ::node::MiniMiner::~MiniMiner(&miniminer_pool);
      ::node::MiniMiner::~MiniMiner(&miniminer_manual);
      std::
      _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
      ::~_Rb_tree(&descendant_caches._M_t);
      std::vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>::
      ~vector(&miniminer_info);
      std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
                (&nonexistent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>);
      std::_Vector_base<CFeeRate,_std::allocator<CFeeRate>_>::~_Vector_base
                (&various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>);
      std::
      map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
      ::~map(&tx_dims);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&all_transactions);
      std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
                (&all_parent_outputs.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>);
      std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
                (&all_spent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>);
      std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
                (&all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return;
    }
    miniminer_manual._0_8_ =
         CTxMemPool::GetEntry
                   (this_00,&((psVar43->
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->hash);
    pcVar32 = "pool.GetEntry(tx->GetHash())";
    ppCVar20 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                         ((CTxMemPoolEntry **)&miniminer_manual,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                          ,0xb6,"test_method","pool.GetEntry(tx->GetHash())");
    this_01 = *ppCVar20;
    peVar3 = (psVar43->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar16 = CTxMemPoolEntry::GetTxSize(this_01);
    miniminer_manual._0_4_ = iVar16;
    miniminer_pool._0_8_ = this_01->m_modified_fee;
    miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ = miniminer_pool._0_8_;
    num_bytes = CTxMemPoolEntry::GetTxSize(this_01);
    CFeeRate::CFeeRate((CFeeRate *)
                       &miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header,
                       (CAmount *)&miniminer_pool,num_bytes);
    p_Var21 = (_Rb_tree_node_base *)operator_new(0x58);
    b = p_Var21 + 1;
    uVar5 = *(undefined8 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    p_Var9 = *(_Base_ptr *)
              ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    p_Var10 = *(_Base_ptr *)
               ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    p_Var21[1]._M_left =
         *(_Base_ptr *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
    ;
    p_Var21[1]._M_right = p_Var10;
    *(undefined8 *)(p_Var21 + 1) = uVar5;
    p_Var21[1]._M_parent = p_Var9;
    *(undefined8 *)(p_Var21 + 2) = miniminer_manual._0_8_;
    p_Var21[2]._M_parent = (_Base_ptr)miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_;
    p_Var21[2]._M_left =
         (_Base_ptr)
         miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
    bVar15 = true;
    pp_Var28 = &tx_dims._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var30 = &p_Var1->_M_header;
    while (p_Var22 = *pp_Var28, p_Var22 != (_Base_ptr)0x0) {
      bVar15 = ::operator<((base_blob<256U> *)b,(base_blob<256U> *)(p_Var22 + 1));
      p_Var30 = p_Var22;
      pp_Var28 = &p_Var22->_M_left + !bVar15;
    }
    p_Var22 = p_Var30;
    if (bVar15 == false) {
LAB_003960ee:
      bVar15 = ::operator<((base_blob<256U> *)(p_Var22 + 1),(base_blob<256U> *)b);
      if (bVar15) goto LAB_003960fe;
      operator_delete(p_Var21,0x58);
    }
    else {
      if (p_Var30 != tx_dims._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
        p_Var22 = (_Base_ptr)std::_Rb_tree_decrement((_Rb_tree_node_base *)p_Var30);
        goto LAB_003960ee;
      }
LAB_003960fe:
      if (p_Var1 == (_Rb_tree_header *)p_Var30) {
        bVar15 = true;
      }
      else {
        bVar15 = ::operator<((base_blob<256U> *)b,(base_blob<256U> *)(p_Var30 + 1));
      }
      std::_Rb_tree_insert_and_rebalance
                (bVar15,p_Var21,(_Rb_tree_node_base *)p_Var30,(_Rb_tree_node_base *)p_Var1);
      tx_dims._M_t._M_impl.super__Rb_tree_header._M_node_count =
           tx_dims._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
    }
    psVar43 = psVar43 + 1;
  } while( true );
}

Assistant:

BOOST_FIXTURE_TEST_CASE(miniminer_1p1c, TestChain100Setup)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(::cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    // Create a parent tx0 and child tx1 with normal fees:
    const auto tx0 = make_tx({COutPoint{m_coinbase_txns[0]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(med_fee).FromTx(tx0));
    const auto tx1 = make_tx({COutPoint{tx0->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(med_fee).FromTx(tx1));

    // Create a low-feerate parent tx2 and high-feerate child tx3 (cpfp)
    const auto tx2 = make_tx({COutPoint{m_coinbase_txns[1]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx2));
    const auto tx3 = make_tx({COutPoint{tx2->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx3));

    // Create a parent tx4 and child tx5 where both have low fees
    const auto tx4 = make_tx({COutPoint{m_coinbase_txns[2]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx4));
    const auto tx5 = make_tx({COutPoint{tx4->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx5));
    const CAmount tx5_delta{CENT/100};
    // Make tx5's modified fee much higher than its base fee. This should cause it to pass
    // the fee-related checks despite being low-feerate.
    pool.PrioritiseTransaction(tx5->GetHash(), tx5_delta);
    const CAmount tx5_mod_fee{low_fee + tx5_delta};

    // Create a high-feerate parent tx6, low-feerate child tx7
    const auto tx6 = make_tx({COutPoint{m_coinbase_txns[3]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx6));
    const auto tx7 = make_tx({COutPoint{tx6->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx7));

    std::vector<COutPoint> all_unspent_outpoints({
        COutPoint{tx0->GetHash(), 1},
        COutPoint{tx1->GetHash(), 0},
        COutPoint{tx2->GetHash(), 1},
        COutPoint{tx3->GetHash(), 0},
        COutPoint{tx4->GetHash(), 1},
        COutPoint{tx5->GetHash(), 0},
        COutPoint{tx6->GetHash(), 1},
        COutPoint{tx7->GetHash(), 0}
    });
    for (const auto& outpoint : all_unspent_outpoints) BOOST_CHECK(!pool.isSpent(outpoint));

    std::vector<COutPoint> all_spent_outpoints({
        COutPoint{tx0->GetHash(), 0},
        COutPoint{tx2->GetHash(), 0},
        COutPoint{tx4->GetHash(), 0},
        COutPoint{tx6->GetHash(), 0}
    });
    for (const auto& outpoint : all_spent_outpoints) BOOST_CHECK(pool.GetConflictTx(outpoint) != nullptr);

    std::vector<COutPoint> all_parent_outputs({
        COutPoint{tx0->GetHash(), 0},
        COutPoint{tx0->GetHash(), 1},
        COutPoint{tx2->GetHash(), 0},
        COutPoint{tx2->GetHash(), 1},
        COutPoint{tx4->GetHash(), 0},
        COutPoint{tx4->GetHash(), 1},
        COutPoint{tx6->GetHash(), 0},
        COutPoint{tx6->GetHash(), 1}
    });


    std::vector<CTransactionRef> all_transactions{tx0, tx1, tx2, tx3, tx4, tx5, tx6, tx7};
    struct TxDimensions {
        int32_t vsize; CAmount mod_fee; CFeeRate feerate;
    };
    std::map<uint256, TxDimensions> tx_dims;
    for (const auto& tx : all_transactions) {
        const auto& entry{*Assert(pool.GetEntry(tx->GetHash()))};
        tx_dims.emplace(tx->GetHash(), TxDimensions{entry.GetTxSize(), entry.GetModifiedFee(),
                                              CFeeRate(entry.GetModifiedFee(), entry.GetTxSize())});
    }

    const std::vector<CFeeRate> various_normal_feerates({CFeeRate(0), CFeeRate(500), CFeeRate(999),
                                                         CFeeRate(1000), CFeeRate(2000), CFeeRate(2500),
                                                         CFeeRate(3333), CFeeRate(7800), CFeeRate(11199),
                                                         CFeeRate(23330), CFeeRate(50000), CFeeRate(5*CENT)});

    // All nonexistent entries have a bumpfee of zero, regardless of feerate
    std::vector<COutPoint> nonexistent_outpoints({ COutPoint{Txid::FromUint256(GetRandHash()), 0}, COutPoint{Txid::FromUint256(GetRandHash()), 3} });
    for (const auto& outpoint : nonexistent_outpoints) BOOST_CHECK(!pool.isSpent(outpoint));
    for (const auto& feerate : various_normal_feerates) {
        node::MiniMiner mini_miner(pool, nonexistent_outpoints);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(feerate);
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        BOOST_CHECK(bump_fees.size() == nonexistent_outpoints.size());
        for (const auto& outpoint: nonexistent_outpoints) {
            auto it = bump_fees.find(outpoint);
            BOOST_CHECK(it != bump_fees.end());
            BOOST_CHECK_EQUAL(it->second, 0);
        }
    }

    // Gather bump fees for all available UTXOs.
    for (const auto& target_feerate : various_normal_feerates) {
        node::MiniMiner mini_miner(pool, all_unspent_outpoints);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(target_feerate);
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        BOOST_CHECK_EQUAL(bump_fees.size(), all_unspent_outpoints.size());

        // Check tx0 bumpfee: no other bumper.
        const TxDimensions& tx0_dimensions = tx_dims.find(tx0->GetHash())->second;
        CAmount bumpfee0 = Find(bump_fees, COutPoint{tx0->GetHash(), 1});
        if (target_feerate <= tx0_dimensions.feerate) {
            BOOST_CHECK_EQUAL(bumpfee0, 0);
        } else {
            // Difference is fee to bump tx0 from current to target feerate.
            BOOST_CHECK_EQUAL(bumpfee0, target_feerate.GetFee(tx0_dimensions.vsize) - tx0_dimensions.mod_fee);
        }

        // Check tx2 bumpfee: assisted by tx3.
        const TxDimensions& tx2_dimensions = tx_dims.find(tx2->GetHash())->second;
        const TxDimensions& tx3_dimensions = tx_dims.find(tx3->GetHash())->second;
        const CFeeRate tx2_feerate = CFeeRate(tx2_dimensions.mod_fee + tx3_dimensions.mod_fee, tx2_dimensions.vsize + tx3_dimensions.vsize);
        CAmount bumpfee2 = Find(bump_fees, COutPoint{tx2->GetHash(), 1});
        if (target_feerate <= tx2_feerate) {
            // As long as target feerate is below tx3's ancestor feerate, there is no bump fee.
            BOOST_CHECK_EQUAL(bumpfee2, 0);
        } else {
            // Difference is fee to bump tx2 from current to target feerate, without tx3.
            BOOST_CHECK_EQUAL(bumpfee2, target_feerate.GetFee(tx2_dimensions.vsize) - tx2_dimensions.mod_fee);
        }

        // If tx5’s modified fees are sufficient for tx4 and tx5 to be picked
        // into the block, our prospective new transaction would not need to
        // bump tx4 when using tx4’s second output. If however even tx5’s
        // modified fee (which essentially indicates "effective feerate") is
        // not sufficient to bump tx4, using the second output of tx4 would
        // require our transaction to bump tx4 from scratch since we evaluate
        // transaction packages per ancestor sets and do not consider multiple
        // children’s fees.
        const TxDimensions& tx4_dimensions = tx_dims.find(tx4->GetHash())->second;
        const TxDimensions& tx5_dimensions = tx_dims.find(tx5->GetHash())->second;
        const CFeeRate tx4_feerate = CFeeRate(tx4_dimensions.mod_fee + tx5_dimensions.mod_fee, tx4_dimensions.vsize + tx5_dimensions.vsize);
        CAmount bumpfee4 = Find(bump_fees, COutPoint{tx4->GetHash(), 1});
        if (target_feerate <= tx4_feerate) {
            // As long as target feerate is below tx5's ancestor feerate, there is no bump fee.
            BOOST_CHECK_EQUAL(bumpfee4, 0);
        } else {
            // Difference is fee to bump tx4 from current to target feerate, without tx5.
            BOOST_CHECK_EQUAL(bumpfee4, target_feerate.GetFee(tx4_dimensions.vsize) - tx4_dimensions.mod_fee);
        }
    }
    // Spent outpoints should usually not be requested as they would not be
    // considered available. However, when they are explicitly requested, we
    // can calculate their bumpfee to facilitate RBF-replacements
    for (const auto& target_feerate : various_normal_feerates) {
        node::MiniMiner mini_miner_all_spent(pool, all_spent_outpoints);
        BOOST_CHECK(mini_miner_all_spent.IsReadyToCalculate());
        auto bump_fees_all_spent = mini_miner_all_spent.CalculateBumpFees(target_feerate);
        BOOST_CHECK(!mini_miner_all_spent.IsReadyToCalculate());
        BOOST_CHECK_EQUAL(bump_fees_all_spent.size(), all_spent_outpoints.size());
        node::MiniMiner mini_miner_all_parents(pool, all_parent_outputs);
        BOOST_CHECK(mini_miner_all_parents.IsReadyToCalculate());
        auto bump_fees_all_parents = mini_miner_all_parents.CalculateBumpFees(target_feerate);
        BOOST_CHECK(!mini_miner_all_parents.IsReadyToCalculate());
        BOOST_CHECK_EQUAL(bump_fees_all_parents.size(), all_parent_outputs.size());
        for (auto& bump_fees : {bump_fees_all_parents, bump_fees_all_spent}) {
            // For all_parents case, both outputs from the parent should have the same bump fee,
            // even though only one of them is in a to-be-replaced transaction.
            BOOST_CHECK(sanity_check(all_transactions, bump_fees));

            // Check tx0 bumpfee: no other bumper.
            const TxDimensions& tx0_dimensions = tx_dims.find(tx0->GetHash())->second;
            CAmount it0_spent = Find(bump_fees, COutPoint{tx0->GetHash(), 0});
            if (target_feerate <= tx0_dimensions.feerate) {
                BOOST_CHECK_EQUAL(it0_spent, 0);
            } else {
                // Difference is fee to bump tx0 from current to target feerate.
                BOOST_CHECK_EQUAL(it0_spent, target_feerate.GetFee(tx0_dimensions.vsize) - tx0_dimensions.mod_fee);
            }

            // Check tx2 bumpfee: no other bumper, because tx3 is to-be-replaced.
            const TxDimensions& tx2_dimensions = tx_dims.find(tx2->GetHash())->second;
            const CFeeRate tx2_feerate_unbumped = tx2_dimensions.feerate;
            auto it2_spent = Find(bump_fees, COutPoint{tx2->GetHash(), 0});
            if (target_feerate <= tx2_feerate_unbumped) {
                BOOST_CHECK_EQUAL(it2_spent, 0);
            } else {
                // Difference is fee to bump tx2 from current to target feerate, without tx3.
                BOOST_CHECK_EQUAL(it2_spent, target_feerate.GetFee(tx2_dimensions.vsize) - tx2_dimensions.mod_fee);
            }

            // Check tx4 bumpfee: no other bumper, because tx5 is to-be-replaced.
            const TxDimensions& tx4_dimensions = tx_dims.find(tx4->GetHash())->second;
            const CFeeRate tx4_feerate_unbumped = tx4_dimensions.feerate;
            auto it4_spent = Find(bump_fees, COutPoint{tx4->GetHash(), 0});
            if (target_feerate <= tx4_feerate_unbumped) {
                BOOST_CHECK_EQUAL(it4_spent, 0);
            } else {
                // Difference is fee to bump tx4 from current to target feerate, without tx5.
                BOOST_CHECK_EQUAL(it4_spent, target_feerate.GetFee(tx4_dimensions.vsize) - tx4_dimensions.mod_fee);
            }
        }
    }

    // Check m_inclusion_order for equivalent mempool- and manually-constructed MiniMiners.
    // (We cannot check bump fees in manually-constructed MiniMiners because it doesn't know what
    // outpoints are requested).
    std::vector<node::MiniMinerMempoolEntry> miniminer_info;
    {
        const int32_t tx0_vsize{tx_dims.at(tx0->GetHash()).vsize};
        const int32_t tx1_vsize{tx_dims.at(tx1->GetHash()).vsize};
        const int32_t tx2_vsize{tx_dims.at(tx2->GetHash()).vsize};
        const int32_t tx3_vsize{tx_dims.at(tx3->GetHash()).vsize};
        const int32_t tx4_vsize{tx_dims.at(tx4->GetHash()).vsize};
        const int32_t tx5_vsize{tx_dims.at(tx5->GetHash()).vsize};
        const int32_t tx6_vsize{tx_dims.at(tx6->GetHash()).vsize};
        const int32_t tx7_vsize{tx_dims.at(tx7->GetHash()).vsize};

        miniminer_info.emplace_back(tx0,/*vsize_self=*/tx0_vsize,/*vsize_ancestor=*/tx0_vsize,/*fee_self=*/med_fee,/*fee_ancestor=*/med_fee);
        miniminer_info.emplace_back(tx1,               tx1_vsize,       tx0_vsize + tx1_vsize,             med_fee,               2*med_fee);
        miniminer_info.emplace_back(tx2,               tx2_vsize,                   tx2_vsize,             low_fee,                 low_fee);
        miniminer_info.emplace_back(tx3,               tx3_vsize,       tx2_vsize + tx3_vsize,            high_fee,      low_fee + high_fee);
        miniminer_info.emplace_back(tx4,               tx4_vsize,                   tx4_vsize,             low_fee,                 low_fee);
        miniminer_info.emplace_back(tx5,               tx5_vsize,       tx4_vsize + tx5_vsize,         tx5_mod_fee,   low_fee + tx5_mod_fee);
        miniminer_info.emplace_back(tx6,               tx6_vsize,                   tx6_vsize,            high_fee,                high_fee);
        miniminer_info.emplace_back(tx7,               tx7_vsize,       tx6_vsize + tx7_vsize,             low_fee,      high_fee + low_fee);
    }
    std::map<Txid, std::set<Txid>> descendant_caches;
    descendant_caches.emplace(tx0->GetHash(), std::set<Txid>{tx0->GetHash(), tx1->GetHash()});
    descendant_caches.emplace(tx1->GetHash(), std::set<Txid>{tx1->GetHash()});
    descendant_caches.emplace(tx2->GetHash(), std::set<Txid>{tx2->GetHash(), tx3->GetHash()});
    descendant_caches.emplace(tx3->GetHash(), std::set<Txid>{tx3->GetHash()});
    descendant_caches.emplace(tx4->GetHash(), std::set<Txid>{tx4->GetHash(), tx5->GetHash()});
    descendant_caches.emplace(tx5->GetHash(), std::set<Txid>{tx5->GetHash()});
    descendant_caches.emplace(tx6->GetHash(), std::set<Txid>{tx6->GetHash(), tx7->GetHash()});
    descendant_caches.emplace(tx7->GetHash(), std::set<Txid>{tx7->GetHash()});

    node::MiniMiner miniminer_manual(miniminer_info, descendant_caches);
    // Use unspent outpoints to avoid entries being omitted.
    node::MiniMiner miniminer_pool(pool, all_unspent_outpoints);
    BOOST_CHECK(miniminer_manual.IsReadyToCalculate());
    BOOST_CHECK(miniminer_pool.IsReadyToCalculate());
    for (const auto& sequences : {miniminer_manual.Linearize(), miniminer_pool.Linearize()}) {
        // tx6 is selected first: high feerate with no parents to bump
        BOOST_CHECK_EQUAL(Find(sequences, tx6->GetHash()), 0);

        // tx2 + tx3 CPFP are selected next
        BOOST_CHECK_EQUAL(Find(sequences, tx2->GetHash()), 1);
        BOOST_CHECK_EQUAL(Find(sequences, tx3->GetHash()), 1);

        // tx4 + prioritised tx5 CPFP
        BOOST_CHECK_EQUAL(Find(sequences, tx4->GetHash()), 2);
        BOOST_CHECK_EQUAL(Find(sequences, tx5->GetHash()), 2);

        BOOST_CHECK_EQUAL(Find(sequences, tx0->GetHash()), 3);
        BOOST_CHECK_EQUAL(Find(sequences, tx1->GetHash()), 3);


        // tx7 is selected last: low feerate with no children
        BOOST_CHECK_EQUAL(Find(sequences, tx7->GetHash()), 4);
    }
}